

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamToolsIndex::LoadReferenceSummary
          (BamToolsIndex *this,BtiReferenceSummary *refSummary)

{
  int iVar1;
  undefined4 extraout_var;
  int numBlocks;
  int local_1c;
  
  LoadNumBlocks(this,&local_1c);
  refSummary->NumBlocks = local_1c;
  iVar1 = (*((this->m_resources).Device)->_vptr_IBamIODevice[7])();
  refSummary->FirstBlockFilePosition = CONCAT44(extraout_var,iVar1);
  SkipBlocks(this,&local_1c);
  return;
}

Assistant:

void BamToolsIndex::LoadReferenceSummary(BtiReferenceSummary& refSummary)
{

    // load number of blocks
    int numBlocks;
    LoadNumBlocks(numBlocks);

    // store block summary data for this reference
    refSummary.NumBlocks = numBlocks;
    refSummary.FirstBlockFilePosition = Tell();

    // skip reference's blocks
    SkipBlocks(numBlocks);
}